

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackSTGZGenerator.cxx
# Opt level: O0

int __thiscall cmCPackSTGZGenerator::GenerateHeader(cmCPackSTGZGenerator *this,ostream *os)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  void *this_00;
  char local_e88 [8];
  char buffer [1024];
  undefined1 local_a68 [8];
  ostringstream cmCPackLog_msg_1;
  char *local_8f0;
  char *ptr;
  string res;
  string local_8a8 [8];
  string packageHeaderText;
  ifstream ifs;
  allocator local_67a;
  allocator local_679;
  string local_678;
  string local_658 [8];
  string inFile;
  char headerLengthTag [26];
  allocator local_611;
  string local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  string local_5d0 [8];
  string licenseText;
  ifstream ilfs;
  undefined1 local_3a8 [8];
  string line;
  string local_380;
  string local_360 [8];
  string inLicFile;
  ostringstream local_338 [4];
  int counter;
  ostringstream str;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream cmCPackLog_msg;
  ostream *os_local;
  cmCPackSTGZGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar4 = std::operator<<((ostream *)local_190,"Writing header");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCPackTGZGenerator).super_cmCPackArchiveGenerator.super_cmCPackGenerator.
           Logger;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackSTGZGenerator.cxx"
                  ,0x44,pcVar5);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::__cxx11::ostringstream::ostringstream(local_338);
  inLicFile.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_380,"CPACK_RESOURCE_FILE_LICENSE",
             (allocator *)(line.field_2._M_local_buf + 0xf));
  pcVar5 = cmCPackGenerator::GetOption((cmCPackGenerator *)this,&local_380);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,pcVar5,(allocator *)(line.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(line.field_2._M_local_buf + 0xe));
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator((allocator<char> *)(line.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)local_3a8);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream((void *)((long)&licenseText.field_2 + 8),pcVar5,_S_in);
  std::__cxx11::string::string(local_5d0);
  while( true ) {
    bVar2 = cmsys::SystemTools::GetLineFromStream
                      ((istream *)(licenseText.field_2._M_local_buf + 8),(string *)local_3a8,
                       (bool *)0x0,-1);
    if (!bVar2) break;
    std::operator+(&local_5f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8,
                   "\n");
    std::__cxx11::string::operator+=(local_5d0,(string *)&local_5f0);
    std::__cxx11::string::~string((string *)&local_5f0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_610,"CPACK_RESOURCE_FILE_LICENSE_CONTENT",&local_611);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCPackGenerator::SetOptionIfNotSet((cmCPackGenerator *)this,&local_610,pcVar5);
  std::__cxx11::string::~string((string *)&local_610);
  std::allocator<char>::~allocator((allocator<char> *)&local_611);
  inFile.field_2._8_1_ = '#';
  inFile.field_2._9_1_ = '#';
  inFile.field_2._10_1_ = '#';
  inFile.field_2._11_1_ = 'C';
  inFile.field_2._12_1_ = 'P';
  inFile.field_2._13_1_ = 'A';
  inFile.field_2._14_1_ = 'C';
  inFile.field_2._15_1_ = 'K';
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_678,"CPACK_STGZ_HEADER_FILE",&local_679);
  pcVar5 = cmCPackGenerator::GetOption((cmCPackGenerator *)this,&local_678);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_658,pcVar5,&local_67a);
  std::allocator<char>::~allocator((allocator<char> *)&local_67a);
  std::__cxx11::string::~string((string *)&local_678);
  std::allocator<char>::~allocator((allocator<char> *)&local_679);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream((void *)((long)&packageHeaderText.field_2 + 8),pcVar5,_S_in);
  std::__cxx11::string::string(local_8a8);
  while( true ) {
    bVar2 = cmsys::SystemTools::GetLineFromStream
                      ((istream *)(packageHeaderText.field_2._M_local_buf + 8),(string *)local_3a8,
                       (bool *)0x0,-1);
    if (!bVar2) break;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&res.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8,
                   "\n");
    std::__cxx11::string::operator+=(local_8a8,(string *)(res.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(res.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::string((string *)&ptr);
  (*(this->super_cmCPackTGZGenerator).super_cmCPackArchiveGenerator.super_cmCPackGenerator.
    _vptr_cmCPackGenerator[0xe])(this,local_8a8,(string *)&ptr);
  for (local_8f0 = (char *)std::__cxx11::string::c_str(); *local_8f0 != '\0';
      local_8f0 = local_8f0 + 1) {
    if (*local_8f0 == '\n') {
      inLicFile.field_2._12_4_ = inLicFile.field_2._12_4_ + 1;
    }
  }
  inLicFile.field_2._12_4_ = inLicFile.field_2._12_4_ + 1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a68);
  poVar4 = std::operator<<((ostream *)local_a68,"Number of lines: ");
  this_00 = (void *)std::ostream::operator<<(poVar4,inLicFile.field_2._12_4_);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCPackTGZGenerator).super_cmCPackArchiveGenerator.super_cmCPackGenerator.
           Logger;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackSTGZGenerator.cxx"
                  ,0x6a,pcVar5);
  std::__cxx11::string::~string((string *)(buffer + 0x3f8));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a68);
  sprintf(local_e88,"%d",(ulong)(uint)inLicFile.field_2._12_4_);
  cmsys::SystemTools::ReplaceString((string *)&ptr,inFile.field_2._M_local_buf + 8,local_e88);
  std::operator<<(os,(string *)&ptr);
  iVar3 = cmCPackArchiveGenerator::GenerateHeader((cmCPackArchiveGenerator *)this,os);
  std::__cxx11::string::~string((string *)&ptr);
  std::__cxx11::string::~string(local_8a8);
  std::ifstream::~ifstream((void *)((long)&packageHeaderText.field_2 + 8));
  std::__cxx11::string::~string(local_658);
  std::__cxx11::string::~string(local_5d0);
  std::ifstream::~ifstream((void *)((long)&licenseText.field_2 + 8));
  std::__cxx11::string::~string((string *)local_3a8);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::ostringstream::~ostringstream(local_338);
  return iVar3;
}

Assistant:

int cmCPackSTGZGenerator::GenerateHeader(std::ostream* os)
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Writing header" << std::endl);
  std::ostringstream str;
  int counter = 0;

  std::string inLicFile = this->GetOption("CPACK_RESOURCE_FILE_LICENSE");
  std::string line;
  cmsys::ifstream ilfs(inLicFile.c_str());
  std::string licenseText;
  while (cmSystemTools::GetLineFromStream(ilfs, line)) {
    licenseText += line + "\n";
  }
  this->SetOptionIfNotSet("CPACK_RESOURCE_FILE_LICENSE_CONTENT",
                          licenseText.c_str());

  const char headerLengthTag[] = "###CPACK_HEADER_LENGTH###";

  // Create the header
  std::string inFile = this->GetOption("CPACK_STGZ_HEADER_FILE");
  cmsys::ifstream ifs(inFile.c_str());
  std::string packageHeaderText;
  while (cmSystemTools::GetLineFromStream(ifs, line)) {
    packageHeaderText += line + "\n";
  }

  // Configure in the values
  std::string res;
  this->ConfigureString(packageHeaderText, res);

  // Count the lines
  const char* ptr = res.c_str();
  while (*ptr) {
    if (*ptr == '\n') {
      counter++;
    }
    ++ptr;
  }
  counter++;
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Number of lines: " << counter
                                                           << std::endl);
  char buffer[1024];
  sprintf(buffer, "%d", counter);
  cmSystemTools::ReplaceString(res, headerLengthTag, buffer);

  // Write in file
  *os << res;
  return this->Superclass::GenerateHeader(os);
}